

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall Graph<Node>::resize(Graph<Node> *this,int newSize)

{
  bool bVar1;
  uint uVar2;
  size_t in_RDX;
  void *__ptr;
  
  this->_nodeCnt = newSize;
  uVar2 = 1;
  do {
    __ptr = (void *)(ulong)uVar2;
    bVar1 = (int)uVar2 < newSize;
    uVar2 = uVar2 * 2;
  } while (bVar1);
  vector<NodeList<Node>_>::realloc(&this->G,__ptr,in_RDX);
  (this->G)._size = newSize;
  initializeRoyFloyd(this);
  return;
}

Assistant:

void resize(int newSize) {
        _nodeCnt = newSize;
        G.resize(newSize);
        initializeRoyFloyd();
    }